

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

double __thiscall HPresolve::getRowDualPost(HPresolve *this,int row,int col)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pdVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  
  uVar13 = (ulong)col;
  piVar5 = (this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (long)(this->super_HPreData).Astart.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
  uVar15 = uVar13;
  if (uVar13 < uVar10) {
    piVar6 = (this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = (long)(this->super_HPreData).Aend.super__Vector_base<int,_std::allocator<int>_>._M_impl
                   .super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
    if (uVar13 < uVar10) {
      iVar3 = piVar5[uVar13];
      uVar11 = (ulong)iVar3;
      iVar4 = piVar6[uVar13];
      dVar21 = 0.0;
      iVar9 = iVar4;
      if (iVar4 < iVar3) {
        iVar9 = iVar3;
      }
      if (iVar3 < iVar4) {
        piVar5 = (this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar12 = (long)(this->super_HPreData).Aindex.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
        piVar6 = (this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar16 = (long)(this->super_HPreData).flagRow.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
        pdVar7 = (this->super_HPreData).Avalue.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar17 = (long)(this->super_HPreData).Avalue.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
        pdVar8 = (this->super_HPreData).valueRowDual.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar18 = (long)(this->super_HPreData).valueRowDual.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
        uVar19 = uVar11;
        do {
          if (uVar12 <= uVar19) {
            uVar10 = uVar12;
            uVar15 = uVar11;
            if (uVar11 < uVar12) {
              uVar15 = uVar12;
            }
            goto LAB_00149375;
          }
          iVar3 = piVar5[uVar19];
          uVar14 = (ulong)iVar3;
          uVar10 = uVar16;
          uVar15 = uVar14;
          if (uVar16 <= uVar14) goto LAB_00149375;
          if ((iVar3 != row) && (piVar6[uVar14] != 0)) {
            uVar10 = uVar17;
            uVar15 = uVar19;
            if ((uVar17 <= uVar19) || (uVar10 = uVar18, uVar15 = uVar14, uVar18 <= uVar14))
            goto LAB_00149375;
            dVar21 = dVar21 + pdVar7[uVar19] * pdVar8[uVar14];
          }
          uVar19 = uVar19 + 1;
        } while ((long)iVar9 != uVar19);
      }
      pdVar7 = (this->super_HPreData).colCostAtEl.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar10 = (long)(this->super_HPreData).colCostAtEl.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar7 >> 3;
      uVar15 = uVar13;
      if (uVar13 < uVar10) {
        pdVar8 = (this->super_HPreData).valueColDual.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        uVar10 = (long)(this->super_HPreData).valueColDual.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar8 >> 3;
        if (uVar13 < uVar10) {
          dVar1 = pdVar7[uVar13];
          dVar2 = pdVar8[uVar13];
          dVar20 = HPreData::getaij(&this->super_HPreData,row,col);
          return -((dVar21 + dVar1) - dVar2) / dVar20;
        }
      }
    }
  }
LAB_00149375:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15,
             uVar10);
}

Assistant:

double HPresolve::getRowDualPost(int row, int col) {
	double x = 0;

	for (int kk=Astart.at(col); kk<Aend.at(col);++kk)
		if (flagRow.at(Aindex.at(kk)) && Aindex.at(kk) != row)
			x = x + Avalue.at(kk)*valueRowDual.at(Aindex.at(kk));

	x = x + colCostAtEl.at(col) - valueColDual.at(col);

	double y=getaij(row,col);
	return -x/y;
}